

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

FilePath *
testing::internal::FilePath::MakeFileName
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *base_name,int number,
          char *extension)

{
  undefined8 *puVar1;
  long *plVar2;
  size_type *psVar3;
  size_type *psVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  pointer pcVar7;
  undefined8 uVar8;
  string local_118;
  size_type *local_f8;
  string file;
  long local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  long lStack_c0;
  long *local_b8;
  undefined8 local_b0;
  long local_a8;
  undefined8 uStack_a0;
  size_type *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  size_type *psStack_70;
  int number_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_f8 = &file._M_string_length;
  file._M_dataplus._M_p = (pointer)0x0;
  file._M_string_length._0_1_ = 0;
  __str.field_2._12_4_ = number;
  if (number == 0) {
    pcVar7 = (base_name->pathname_)._M_dataplus._M_p;
    psStack_70 = &__str_1._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&stack0xffffffffffffff90,pcVar7,
               pcVar7 + (base_name->pathname_)._M_string_length);
    std::__cxx11::string::append((char *)&stack0xffffffffffffff90);
    plVar2 = (long *)std::__cxx11::string::append((char *)&stack0xffffffffffffff90);
    psVar3 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar3) {
      local_40._M_allocated_capacity = *psVar3;
      local_40._8_8_ = plVar2[3];
      __str_1.field_2._8_8_ = &local_40;
    }
    else {
      local_40._M_allocated_capacity = *psVar3;
      __str_1.field_2._8_8_ = (size_type *)*plVar2;
    }
    *plVar2 = (long)psVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=
              ((string *)&local_f8,(string *)(__str_1.field_2._M_local_buf + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str_1.field_2._8_8_ != &local_40) {
      operator_delete((void *)__str_1.field_2._8_8_,local_40._M_allocated_capacity + 1);
    }
    if (psStack_70 != &__str_1._M_string_length) {
      operator_delete(psStack_70,__str_1._M_string_length + 1);
    }
    goto LAB_00134132;
  }
  psVar3 = &__str._M_string_length;
  pcVar7 = (base_name->pathname_)._M_dataplus._M_p;
  local_98 = psVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar7,pcVar7 + (base_name->pathname_)._M_string_length);
  std::__cxx11::string::append((char *)&local_98);
  StreamableToString<int>(&local_118,(int *)(__str.field_2._M_local_buf + 0xc));
  pcVar7 = (pointer)0xf;
  if (local_98 != psVar3) {
    pcVar7 = (pointer)__str._M_string_length;
  }
  if (pcVar7 < __str._M_dataplus._M_p + local_118._M_string_length) {
    uVar8 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      uVar8 = local_118.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < __str._M_dataplus._M_p + local_118._M_string_length) goto LAB_00133ec6;
    puVar1 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_118,0,(char *)0x0,(ulong)local_98);
  }
  else {
LAB_00133ec6:
    puVar1 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_118._M_dataplus._M_p);
  }
  local_b8 = &local_a8;
  plVar2 = puVar1 + 2;
  if ((long *)*puVar1 == plVar2) {
    local_a8 = *plVar2;
    uStack_a0 = puVar1[3];
  }
  else {
    local_a8 = *plVar2;
    local_b8 = (long *)*puVar1;
  }
  local_b0 = puVar1[1];
  *puVar1 = plVar2;
  puVar1[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b8);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    __str_1._M_string_length = *psVar4;
    __str_1.field_2._M_allocated_capacity = plVar2[3];
    psStack_70 = &__str_1._M_string_length;
  }
  else {
    __str_1._M_string_length = *psVar4;
    psStack_70 = (size_type *)*plVar2;
  }
  __str_1._M_dataplus._M_p = (pointer)plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&stack0xffffffffffffff90);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    local_40._M_allocated_capacity = *psVar4;
    local_40._8_8_ = plVar2[3];
    __str_1.field_2._8_8_ = &local_40;
  }
  else {
    local_40._M_allocated_capacity = *psVar4;
    __str_1.field_2._8_8_ = (size_type *)*plVar2;
  }
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_f8,(string *)(__str_1.field_2._M_local_buf + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1.field_2._8_8_ != &local_40) {
    operator_delete((void *)__str_1.field_2._8_8_,local_40._M_allocated_capacity + 1);
  }
  if (psStack_70 != &__str_1._M_string_length) {
    operator_delete(psStack_70,__str_1._M_string_length + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,(ulong)(local_118.field_2._M_allocated_capacity + 1))
    ;
  }
  if (local_98 != psVar3) {
    operator_delete(local_98,__str._M_string_length + 1);
  }
LAB_00134132:
  file.field_2._8_8_ = &local_c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)((long)&file.field_2 + 8),local_f8,file._M_dataplus._M_p + (long)local_f8);
  if ((undefined1 *)file.field_2._8_8_ == &local_c8) {
    local_40._8_8_ = lStack_c0;
    file.field_2._8_8_ = &local_40;
  }
  local_40._M_allocated_capacity._1_7_ = uStack_c7;
  local_40._M_local_buf[0] = local_c8;
  local_c8 = 0;
  paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)file.field_2._8_8_;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)file.field_2._8_8_;
  if (local_d0 != 0) {
    do {
      if ((paVar5 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)file.field_2._8_8_ || paVar6->_M_local_buf[0] != '/') ||
         (paVar5->_M_local_buf[-1] != '/')) {
        paVar5->_M_local_buf[0] = paVar6->_M_local_buf[0];
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar5->_M_local_buf + 1);
      }
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(paVar6->_M_local_buf + 1);
    } while (paVar6 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(file.field_2._8_8_ + local_d0));
  }
  paVar5->_M_local_buf[0] = '\0';
  __str_1.field_2._8_8_ = file.field_2._8_8_;
  file.field_2._8_8_ = &local_c8;
  ConcatPaths(__return_storage_ptr__,directory,(FilePath *)((long)&__str_1.field_2 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str_1.field_2._8_8_ != &local_40) {
    operator_delete((void *)__str_1.field_2._8_8_,local_40._M_allocated_capacity + 1);
  }
  if ((undefined1 *)file.field_2._8_8_ != &local_c8) {
    operator_delete((void *)file.field_2._8_8_,CONCAT71(uStack_c7,local_c8) + 1);
  }
  if (local_f8 != &file._M_string_length) {
    operator_delete(local_f8,CONCAT71(file._M_string_length._1_7_,(undefined1)file._M_string_length)
                             + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::MakeFileName(const FilePath& directory,
                                const FilePath& base_name, int number,
                                const char* extension) {
  std::string file;
  if (number == 0) {
    file = base_name.string() + "." + extension;
  } else {
    file =
        base_name.string() + "_" + StreamableToString(number) + "." + extension;
  }
  return ConcatPaths(directory, FilePath(file));
}